

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpccheck.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  ostream *poVar5;
  vector<double,_std::allocator<double>_> *sequence_to_read;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_10;
  ostringstream error_message_9;
  ostringstream error_message_8;
  ostringstream error_message_7;
  bool is_stable;
  int frame_index;
  vector<double,_std::allocator<double>_> linear_predictive_coefficients;
  int length;
  ostringstream error_message_6;
  Buffer buffer;
  LinearPredictiveCoefficientsStabilityCheck linear_predictive_coefficients_stability_check;
  istream *input_stream;
  ostringstream error_message_5;
  ifstream ifs;
  ostringstream error_message_4;
  char *input_file;
  ostringstream error_message_3;
  int num_rest_args;
  ostringstream error_message_2;
  ostringstream error_message_1;
  int tmp;
  int max;
  int min;
  ostringstream error_message;
  int option_char;
  bool modification_flag;
  double margin;
  WarningType warning_type;
  int num_order;
  option *in_stack_ffffffffffffe908;
  Buffer *in_stack_ffffffffffffe910;
  undefined7 in_stack_ffffffffffffe918;
  undefined1 in_stack_ffffffffffffe91f;
  Buffer *in_stack_ffffffffffffe920;
  LinearPredictiveCoefficientsStabilityCheck *in_stack_ffffffffffffe928;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe930;
  allocator *paVar6;
  undefined4 in_stack_ffffffffffffe938;
  int in_stack_ffffffffffffe93c;
  LinearPredictiveCoefficientsStabilityCheck *in_stack_ffffffffffffe940;
  undefined6 in_stack_ffffffffffffe948;
  undefined1 in_stack_ffffffffffffe94e;
  undefined1 in_stack_ffffffffffffe94f;
  LinearPredictiveCoefficientsStabilityCheck *this;
  undefined8 in_stack_ffffffffffffe960;
  int *actual_read_size;
  char *local_1648;
  byte local_15d2;
  bool local_15a2;
  undefined1 local_1581 [33];
  ostringstream local_1560 [88];
  ostringstream *in_stack_ffffffffffffeaf8;
  string *in_stack_ffffffffffffeb00;
  undefined1 local_13e1 [33];
  ostringstream local_13c0 [383];
  allocator local_1241;
  string local_1240 [32];
  ostringstream local_1220 [383];
  allocator local_10a1;
  string local_10a0 [32];
  ostringstream local_1080 [383];
  byte local_f01;
  int local_f00;
  undefined1 local_ef9 [33];
  string local_ed8 [32];
  ostringstream local_eb8 [472];
  LinearPredictiveCoefficientsStabilityCheck local_ce0;
  int *local_c90;
  uint local_c88;
  allocator local_c81;
  string local_c80 [32];
  ostringstream local_c60 [376];
  int local_ae8 [131];
  allocator local_8d9;
  string local_8d8 [32];
  ostringstream local_8b8 [376];
  char *local_740;
  allocator local_731;
  string local_730 [32];
  ostringstream local_710 [376];
  int local_598;
  allocator local_591;
  string local_590 [32];
  ostringstream local_570 [383];
  allocator local_3f1;
  string local_3f0 [39];
  allocator local_3c9;
  string local_3c8 [32];
  ostringstream local_3a8 [383];
  allocator local_229;
  string local_228 [32];
  int local_208;
  undefined4 local_204;
  undefined4 local_200;
  allocator local_1f9;
  string local_1f8 [32];
  ostringstream local_1d8 [399];
  allocator local_49;
  string local_48 [32];
  int local_28;
  byte local_21;
  double local_20;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_18 = 1;
  local_20 = 1e-16;
  local_21 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_28 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffe920 >> 0x20),
                                   (char **)CONCAT17(in_stack_ffffffffffffe91f,
                                                     in_stack_ffffffffffffe918),
                                   (char *)in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,
                                   (int *)0x1037b3), pcVar1 = ya_optarg, local_28 != -1) {
    switch(local_28) {
    case 0x65:
      local_200 = 0;
      local_204 = 2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,pcVar1,&local_229);
      bVar3 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffe91f,in_stack_ffffffffffffe918),
                         (int *)in_stack_ffffffffffffe910);
      local_15d2 = 1;
      if (bVar3) {
        bVar3 = sptk::IsInRange(local_208,0,2);
        local_15d2 = bVar3 ^ 0xff;
      }
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator((allocator<char> *)&local_229);
      if ((local_15d2 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_3a8);
        poVar5 = std::operator<<((ostream *)local_3a8,
                                 "The argument for the -e option must be an integer ");
        poVar5 = std::operator<<(poVar5,"in the range of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
        poVar5 = std::operator<<(poVar5," to ");
        std::ostream::operator<<(poVar5,2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c8,"lpccheck",&local_3c9);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
        std::__cxx11::string::~string(local_3c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3a8);
        return local_4;
      }
      local_18 = local_208;
      break;
    default:
      anon_unknown.dwarf_1730::PrintUsage((ostream *)in_stack_ffffffffffffe940);
      return 1;
    case 0x68:
      anon_unknown.dwarf_1730::PrintUsage((ostream *)in_stack_ffffffffffffe940);
      return 0;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,pcVar1,&local_49);
      bVar3 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffe91f,in_stack_ffffffffffffe918),
                         (int *)in_stack_ffffffffffffe910);
      local_15a2 = !bVar3 || local_14 < 0;
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      if (local_15a2) {
        std::__cxx11::ostringstream::ostringstream(local_1d8);
        poVar5 = std::operator<<((ostream *)local_1d8,"The argument for the -m option must be a ");
        std::operator<<(poVar5,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f8,"lpccheck",&local_1f9);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
        std::__cxx11::string::~string(local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d8);
        return local_4;
      }
      break;
    case 0x72:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f0,pcVar1,&local_3f1);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT17(in_stack_ffffffffffffe91f,in_stack_ffffffffffffe918),
                         (double *)in_stack_ffffffffffffe910);
      bVar3 = true;
      if ((bVar2) && (bVar3 = true, 0.0 < local_20)) {
        bVar3 = 1.0 <= local_20;
      }
      std::__cxx11::string::~string(local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream(local_570);
        std::operator<<((ostream *)local_570,"The argument for the -r option must be in (0.0, 1.0)")
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_590,"lpccheck",&local_591);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
        std::__cxx11::string::~string(local_590);
        std::allocator<char>::~allocator((allocator<char> *)&local_591);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_570);
        return local_4;
      }
      break;
    case 0x78:
      local_21 = 1;
    }
  }
  local_598 = local_8 - ya_optind;
  if (1 < local_598) {
    std::__cxx11::ostringstream::ostringstream(local_710);
    std::operator<<((ostream *)local_710,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_730,"lpccheck",&local_731);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
    std::__cxx11::string::~string(local_730);
    std::allocator<char>::~allocator((allocator<char> *)&local_731);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_710);
    return local_4;
  }
  if (local_598 == 0) {
    local_1648 = (char *)0x0;
  }
  else {
    local_1648 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_740 = local_1648;
  bVar3 = sptk::SetBinaryMode();
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream(local_8b8);
    std::operator<<((ostream *)local_8b8,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8d8,"lpccheck",&local_8d9);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
    std::__cxx11::string::~string(local_8d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_8b8);
    return local_4;
  }
  std::ifstream::ifstream(local_ae8);
  pcVar1 = local_740;
  if (local_740 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open((char *)local_ae8,(_Ios_Openmode)pcVar1);
    bVar4 = std::ios::fail();
    if ((bVar4 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_c60);
      poVar5 = std::operator<<((ostream *)local_c60,"Cannot open file ");
      std::operator<<(poVar5,local_740);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c80,"lpccheck",&local_c81);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
      std::__cxx11::string::~string(local_c80);
      std::allocator<char>::~allocator((allocator<char> *)&local_c81);
      local_4 = 1;
      local_c88 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_c60);
      goto LAB_00104d07;
    }
  }
  bVar4 = std::ifstream::is_open();
  if ((bVar4 & 1) == 0) {
    actual_read_size = (int *)&std::cin;
  }
  else {
    actual_read_size = local_ae8;
  }
  local_c90 = actual_read_size;
  sptk::LinearPredictiveCoefficientsStabilityCheck::LinearPredictiveCoefficientsStabilityCheck
            (in_stack_ffffffffffffe940,in_stack_ffffffffffffe93c,(double)in_stack_ffffffffffffe930);
  sptk::LinearPredictiveCoefficientsStabilityCheck::Buffer::Buffer(in_stack_ffffffffffffe920);
  bVar3 = sptk::LinearPredictiveCoefficientsStabilityCheck::IsValid(&local_ce0);
  if (bVar3) {
    local_ef9._25_4_ = local_14 + 1;
    sequence_to_read = (vector<double,_std::allocator<double>_> *)(long)(int)local_ef9._25_4_;
    this = (LinearPredictiveCoefficientsStabilityCheck *)local_ef9;
    std::allocator<double>::allocator((allocator<double> *)0x104657);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffe930,(size_type)in_stack_ffffffffffffe928,
               (allocator_type *)in_stack_ffffffffffffe920);
    std::allocator<double>::~allocator((allocator<double> *)0x10467d);
    local_f00 = 0;
    while (in_stack_ffffffffffffe94f =
                sptk::ReadStream<double>
                          (SUB81((ulong)in_stack_ffffffffffffe960 >> 0x30,0),
                           (int)in_stack_ffffffffffffe960,(int)((ulong)this >> 0x20),(int)this,
                           sequence_to_read,
                           (istream *)
                           CONCAT17(in_stack_ffffffffffffe94f,
                                    CONCAT16(in_stack_ffffffffffffe94e,in_stack_ffffffffffffe948)),
                           actual_read_size), (bool)in_stack_ffffffffffffe94f) {
      local_f01 = 0;
      if ((local_21 & 1) != 0) {
        in_stack_ffffffffffffe94e =
             sptk::LinearPredictiveCoefficientsStabilityCheck::Run
                       (in_stack_ffffffffffffe928,
                        (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe920,
                        (bool *)CONCAT17(in_stack_ffffffffffffe91f,in_stack_ffffffffffffe918),
                        in_stack_ffffffffffffe910);
        if (!(bool)in_stack_ffffffffffffe94e) {
          std::__cxx11::ostringstream::ostringstream(local_1080);
          std::operator<<((ostream *)local_1080,
                          "Failed to check stability of linear predictive coefficients");
          paVar6 = &local_10a1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_10a0,"lpccheck",paVar6);
          sptk::PrintErrorMessage(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
          std::__cxx11::string::~string(local_10a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_10a1);
          local_4 = 1;
          local_c88 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1080);
          goto LAB_00104cb1;
        }
        bVar3 = sptk::LinearPredictiveCoefficientsStabilityCheck::Run
                          (this,sequence_to_read,
                           (vector<double,_std::allocator<double>_> *)
                           CONCAT17(in_stack_ffffffffffffe94f,
                                    CONCAT16(in_stack_ffffffffffffe94e,in_stack_ffffffffffffe948)),
                           (bool *)in_stack_ffffffffffffe940,
                           (Buffer *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
        in_stack_ffffffffffffe93c = CONCAT13(bVar3,(int3)in_stack_ffffffffffffe93c);
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream(local_1220);
          std::operator<<((ostream *)local_1220,
                          "Failed to check stability of linear predictive coefficients");
          paVar6 = &local_1241;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1240,"lpccheck",paVar6);
          sptk::PrintErrorMessage(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
          std::__cxx11::string::~string(local_1240);
          std::allocator<char>::~allocator((allocator<char> *)&local_1241);
          local_4 = 1;
          local_c88 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1220);
          goto LAB_00104cb1;
        }
      }
      if (((local_f01 & 1) == 0) && (local_18 != 0)) {
        std::__cxx11::ostringstream::ostringstream(local_13c0);
        in_stack_ffffffffffffe928 =
             (LinearPredictiveCoefficientsStabilityCheck *)
             std::ostream::operator<<(local_13c0,local_f00);
        std::operator<<((ostream *)in_stack_ffffffffffffe928,"th frame is unstable");
        in_stack_ffffffffffffe920 = (Buffer *)local_13e1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_13e1 + 1),"lpccheck",(allocator *)in_stack_ffffffffffffe920);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
        std::__cxx11::string::~string((string *)(local_13e1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_13e1);
        if (local_18 == 2) {
          local_4 = 1;
        }
        local_c88 = (uint)(local_18 == 2);
        std::__cxx11::ostringstream::~ostringstream(local_13c0);
        if (local_c88 != 0) goto LAB_00104cb1;
      }
      in_stack_ffffffffffffe91f =
           sptk::WriteStream<double>
                     ((int)in_stack_ffffffffffffe960,(int)((ulong)this >> 0x20),sequence_to_read,
                      (ostream *)
                      CONCAT17(in_stack_ffffffffffffe94f,
                               CONCAT16(in_stack_ffffffffffffe94e,in_stack_ffffffffffffe948)),
                      (int *)in_stack_ffffffffffffe940);
      if (!(bool)in_stack_ffffffffffffe91f) {
        std::__cxx11::ostringstream::ostringstream(local_1560);
        std::operator<<((ostream *)local_1560,"Failed to write linear predictive coefficients");
        in_stack_ffffffffffffe910 = (Buffer *)local_1581;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_1581 + 1),"lpccheck",(allocator *)in_stack_ffffffffffffe910);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
        std::__cxx11::string::~string((string *)(local_1581 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_1581);
        local_4 = 1;
        local_c88 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1560);
        goto LAB_00104cb1;
      }
      local_f00 = local_f00 + 1;
    }
    local_4 = 0;
    local_c88 = 1;
LAB_00104cb1:
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe920);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_eb8);
    std::operator<<((ostream *)local_eb8,
                    "Failed to initialize LinearPredictiveCoefficientsStabilityCheck");
    paVar6 = (allocator *)(local_ef9 + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ed8,"lpccheck",paVar6);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
    std::__cxx11::string::~string(local_ed8);
    std::allocator<char>::~allocator((allocator<char> *)(local_ef9 + 0x20));
    local_4 = 1;
    local_c88 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_eb8);
  }
  sptk::LinearPredictiveCoefficientsStabilityCheck::Buffer::~Buffer(in_stack_ffffffffffffe910);
  sptk::LinearPredictiveCoefficientsStabilityCheck::~LinearPredictiveCoefficientsStabilityCheck
            ((LinearPredictiveCoefficientsStabilityCheck *)in_stack_ffffffffffffe910);
LAB_00104d07:
  std::ifstream::~ifstream(local_ae8);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  WarningType warning_type(kDefaultWarningType);
  double margin(kDefaultMargin);
  bool modification_flag(kDefaultModificationFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:e:r:xh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lpccheck", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        const int min(0);
        const int max(static_cast<int>(kNumWarningTypes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -e option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("lpccheck", error_message);
          return 1;
        }
        warning_type = static_cast<WarningType>(tmp);
        break;
      }
      case 'r': {
        if (!sptk::ConvertStringToDouble(optarg, &margin) || margin <= 0.0 ||
            1.0 <= margin) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -r option must be in (0.0, 1.0)";
          sptk::PrintErrorMessage("lpccheck", error_message);
          return 1;
        }
        break;
      }
      case 'x': {
        modification_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_rest_args(argc - optind);
  if (1 < num_rest_args) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("lpccheck", error_message);
    return 1;
  }
  const char* input_file(0 == num_rest_args ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("lpccheck", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("lpccheck", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::LinearPredictiveCoefficientsStabilityCheck
      linear_predictive_coefficients_stability_check(num_order, margin);
  sptk::LinearPredictiveCoefficientsStabilityCheck::Buffer buffer;
  if (!linear_predictive_coefficients_stability_check.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize LinearPredictiveCoefficientsStabilityCheck";
    sptk::PrintErrorMessage("lpccheck", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> linear_predictive_coefficients(length);

  for (int frame_index(0);
       sptk::ReadStream(false, 0, 0, length, &linear_predictive_coefficients,
                        &input_stream, NULL);
       ++frame_index) {
    bool is_stable(false);
    if (modification_flag) {
      if (!linear_predictive_coefficients_stability_check.Run(
              &linear_predictive_coefficients, &is_stable, &buffer)) {
        std::ostringstream error_message;
        error_message
            << "Failed to check stability of linear predictive coefficients";
        sptk::PrintErrorMessage("lpccheck", error_message);
        return 1;
      } else {
        if (!linear_predictive_coefficients_stability_check.Run(
                linear_predictive_coefficients, NULL, &is_stable, &buffer)) {
          std::ostringstream error_message;
          error_message
              << "Failed to check stability of linear predictive coefficients";
          sptk::PrintErrorMessage("lpccheck", error_message);
          return 1;
        }
      }
    }

    if (!is_stable && kIgnore != warning_type) {
      std::ostringstream error_message;
      error_message << frame_index << "th frame is unstable";
      sptk::PrintErrorMessage("lpccheck", error_message);
      if (kExit == warning_type) return 1;
    }

    if (!sptk::WriteStream(0, length, linear_predictive_coefficients,
                           &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write linear predictive coefficients";
      sptk::PrintErrorMessage("lpccheck", error_message);
      return 1;
    }
  }

  return 0;
}